

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

void __thiscall
burst::
subset_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>,_std::vector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
::increment(subset_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>,_std::vector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
            *this)

{
  iterator iVar1;
  __normal_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  _Var2;
  difference_type dVar3;
  __normal_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  new_subset_end;
  subset_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>,_std::vector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_local;
  
  iVar1 = subset_begin(this);
  _Var2 = subset_end(this);
  _Var2 = next_subset<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>*,std::vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>
                    (iVar1._M_current,_Var2._M_current,(this->m_begin)._M_current,
                     (this->m_end)._M_current);
  iVar1 = subset_begin(this);
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>*,std::vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>
                    ((__normal_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                      )iVar1._M_current,_Var2);
  this->m_subset_size = dVar3;
  return;
}

Assistant:

void increment ()
        {
            const auto new_subset_end =
                next_subset(subset_begin(), subset_end(), m_begin, m_end, m_compare);
            m_subset_size = std::distance(subset_begin(), new_subset_end);
        }